

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O3

void do_cmd_fire_at_nearest(void)

{
  wchar_t wVar1;
  _Bool _Var2;
  object *poVar3;
  command_conflict *pcVar4;
  ulong uVar5;
  char *fmt;
  
  poVar3 = equipped_item_by_slot_name(player,"shooting");
  if (poVar3 != (object *)0x0) {
    wVar1 = (player->state).ammo_tval;
    if (wVar1 != L'\0') {
      if ((ulong)z_info->quiver_size != 0) {
        uVar5 = 0;
        do {
          poVar3 = player->upkeep->quiver[uVar5];
          if ((poVar3 != (object *)0x0) && (wVar1 == (uint)poVar3->tval)) {
            _Var2 = target_set_closest(L'\x11',(monster_predicate)0x0);
            if (_Var2) {
              cmdq_push(CMD_FIRE);
              pcVar4 = cmdq_peek();
              cmd_set_arg_item(pcVar4,"item",poVar3);
              pcVar4 = cmdq_peek();
              cmd_set_arg_target(pcVar4,"target",L'\x05');
              return;
            }
            return;
          }
          uVar5 = uVar5 + 1;
        } while (z_info->quiver_size != uVar5);
      }
      fmt = "You have no ammunition in the quiver to fire.";
      goto LAB_001b2fb8;
    }
  }
  fmt = "You have nothing to fire with.";
LAB_001b2fb8:
  msg(fmt);
  return;
}

Assistant:

void do_cmd_fire_at_nearest(void) {
	int i, dir = DIR_TARGET;
	struct object *ammo = NULL;
	struct object *bow = equipped_item_by_slot_name(player, "shooting");

	/* Require a usable launcher */
	if (!bow || !player->state.ammo_tval) {
		msg("You have nothing to fire with.");
		return;
	}

	/* Find first eligible ammo in the quiver */
	for (i = 0; i < z_info->quiver_size; i++) {
		if (!player->upkeep->quiver[i])
			continue;
		if (player->upkeep->quiver[i]->tval != player->state.ammo_tval)
			continue;
		ammo = player->upkeep->quiver[i];
		break;
	}

	/* Require usable ammo */
	if (!ammo) {
		msg("You have no ammunition in the quiver to fire.");
		return;
	}

	/* Require foe */
	if (!target_set_closest((TARGET_KILL | TARGET_QUIET), NULL)) return;

	/* Fire! */
	cmdq_push(CMD_FIRE);
	cmd_set_arg_item(cmdq_peek(), "item", ammo);
	cmd_set_arg_target(cmdq_peek(), "target", dir);
}